

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.cpp
# Opt level: O3

Udata * luaS_newudata(lua_State *L,size_t s,Table *e)

{
  GCObject *pGVar1;
  
  if (s < 0xffffffffffffffd6) {
    pGVar1 = luaC_newobj(L,7,s + 0x28,(GCObject **)0x0,0);
    (pGVar1->h).node = (Node *)s;
    (pGVar1->h).metatable = (Table *)0x0;
    (pGVar1->h).array = (TValue *)e;
    return (Udata *)pGVar1;
  }
  luaM_toobig(L);
}

Assistant:

Udata *luaS_newudata (lua_State *L, size_t s, Table *e) {
  Udata *u;
  if (s > MAX_SIZET - sizeof(Udata))
    luaM_toobig(L);
  u = &luaC_newobj(L, LUA_TUSERDATA, sizeof(Udata) + s, NULL, 0)->u;
  u->uv.len = s;
  u->uv.metatable = NULL;
  u->uv.env = e;
  return u;
}